

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDitheringTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles3::Functional::DitheringCase::drawAndCheckUnicoloredQuad
          (DitheringCase *this,Vec4 *quadColor)

{
  ostringstream *poVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  RenderContext *context;
  int height;
  bool bVar3;
  deUint32 dVar4;
  int iVar5;
  int iVar6;
  GLenum GVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long *plVar8;
  ostream *poVar9;
  size_t *psVar10;
  long *plVar11;
  Surface *pSVar12;
  long lVar13;
  void *__buf;
  void *__buf_00;
  uint uVar14;
  char *pcVar15;
  uint uVar16;
  bool bVar17;
  ulong uVar18;
  Surface renderedImg;
  Surface errorMask;
  Random rnd;
  allocator<char> local_3d9;
  TextureFormat local_3d8;
  Surface local_3d0;
  size_t *local_3b8;
  void *local_3b0;
  size_t local_3a8;
  long lStack_3a0;
  Vec4 *local_398;
  string local_390;
  long *local_370;
  long local_368;
  long local_360;
  long lStack_358;
  long *local_350 [2];
  long local_340 [2];
  string local_330;
  long *local_310 [2];
  long local_300 [2];
  LogImage local_2f0;
  undefined1 local_260 [32];
  _Alloc_hider local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230 [4];
  ios_base local_1f0 [8];
  ios_base local_1e8 [264];
  deRandom local_e0;
  Quad local_d0;
  
  local_3d8 = (TextureFormat)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_398 = quadColor;
  dVar4 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&local_e0,dVar4);
  iVar5 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar5 = *(int *)CONCAT44(extraout_var,iVar5);
  if (0x1f < iVar5) {
    iVar5 = 0x20;
  }
  iVar6 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar6 = *(int *)(CONCAT44(extraout_var_00,iVar6) + 4);
  height = 0x20;
  if (iVar6 < 0x20) {
    height = iVar6;
  }
  iVar6 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar6 = *(int *)CONCAT44(extraout_var_01,iVar6);
  dVar4 = deRandom_getUint32(&local_e0);
  uVar16 = dVar4 % ((iVar6 - iVar5) + 1U);
  iVar6 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar6 = *(int *)(CONCAT44(extraout_var_02,iVar6) + 4);
  dVar4 = deRandom_getUint32(&local_e0);
  uVar14 = dVar4 % ((iVar6 - height) + 1U);
  local_d0.posA.m_data[0] = -1.0;
  local_d0.posA.m_data[1] = -1.0;
  local_d0.posB.m_data = (float  [2])&DAT_3f8000003f800000;
  memset(local_d0.color,0,0x90);
  tcu::Surface::Surface(&local_3d0,iVar5,height);
  glwViewport(uVar16,uVar14,iVar5,height);
  GVar7 = glwGetError();
  glu::checkError(GVar7,"glViewport(viewportX, viewportY, viewportWid, viewportHei)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fDitheringTests.cpp"
                  ,0x170);
  poVar1 = (ostringstream *)(local_260 + 8);
  local_260._0_4_ = local_3d8.order;
  local_260._4_4_ = local_3d8.type;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Dithering is ",0xd);
  pcVar15 = "Rendered image with GL_SAMPLE_COVERAGE disabled";
  if ((ulong)this->m_ditheringEnabled != 0) {
    pcVar15 = "Rendered image with GL_SAMPLE_COVERAGE enabled";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,pcVar15 + 0x27,8 - (ulong)this->m_ditheringEnabled);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_1e8);
  if (this->m_ditheringEnabled == true) {
    glwEnable(0xbd0);
    dVar4 = glwGetError();
    iVar6 = 0x175;
    pcVar15 = "glEnable(GL_DITHER)";
  }
  else {
    glwDisable(0xbd0);
    dVar4 = glwGetError();
    iVar6 = 0x177;
    pcVar15 = "glDisable(GL_DITHER)";
  }
  glu::checkError(dVar4,pcVar15,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fDitheringTests.cpp"
                  ,iVar6);
  poVar1 = (ostringstream *)(local_260 + 8);
  local_260._0_4_ = local_3d8.order;
  local_260._4_4_ = local_3d8.type;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Drawing an unicolored quad with color ",0x26);
  tcu::operator<<((ostream *)poVar1,local_398);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_1e8);
  local_d0.color[0].m_data._0_8_ = *(undefined8 *)local_398->m_data;
  local_d0.color[0].m_data._8_8_ = *(undefined8 *)(local_398->m_data + 2);
  local_d0.color[1].m_data._0_8_ = *(undefined8 *)local_398->m_data;
  local_d0.color[1].m_data._8_8_ = *(undefined8 *)(local_398->m_data + 2);
  local_d0.color[2].m_data._0_8_ = *(undefined8 *)local_398->m_data;
  local_d0.color[2].m_data._8_8_ = *(undefined8 *)(local_398->m_data + 2);
  local_d0.color[3].m_data._0_8_ = *(undefined8 *)local_398->m_data;
  local_d0.color[3].m_data._8_8_ = *(undefined8 *)(local_398->m_data + 2);
  deqp::gls::FragmentOpUtil::QuadRenderer::render(this->m_renderer,&local_d0);
  context = this->m_renderCtx;
  local_2f0.m_name._M_dataplus._M_p = (pointer)0x300000008;
  if ((uint *)local_3d0.m_pixels.m_cap != (uint *)0x0) {
    local_3d0.m_pixels.m_cap = (size_t)local_3d0.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_260,(TextureFormat *)&local_2f0,local_3d0.m_width,
             local_3d0.m_height,1,(void *)local_3d0.m_pixels.m_cap);
  glu::readPixels(context,uVar16,uVar14,(PixelBufferAccess *)local_260);
  GVar7 = glwGetError();
  glu::checkError(GVar7,"glReadPixels()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fDitheringTests.cpp"
                  ,0x183);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_260);
  std::ostream::operator<<(local_260,this->m_iteration);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_260);
  std::ios_base::~ios_base(local_1f0);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)local_310,0,(char *)0x0,0xb37545);
  psVar10 = (size_t *)(plVar8 + 2);
  if ((size_t *)*plVar8 == psVar10) {
    local_3a8 = *psVar10;
    lStack_3a0 = plVar8[3];
    local_3b8 = &local_3a8;
  }
  else {
    local_3a8 = *psVar10;
    local_3b8 = (size_t *)*plVar8;
  }
  local_3b0 = (void *)plVar8[1];
  *plVar8 = (long)psVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_390,(char *)local_3b8,&local_3d9);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_260);
  std::ostream::operator<<(local_260,this->m_iteration);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_260);
  std::ios_base::~ios_base(local_1f0);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)local_350,0,(char *)0x0,0xb3754a);
  plVar11 = plVar8 + 2;
  if ((long *)*plVar8 == plVar11) {
    local_360 = *plVar11;
    lStack_358 = plVar8[3];
    local_370 = &local_360;
  }
  else {
    local_360 = *plVar11;
    local_370 = (long *)*plVar8;
  }
  local_368 = plVar8[1];
  *plVar8 = (long)plVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_330,(char *)local_370,(allocator<char> *)local_260);
  pSVar12 = &local_3d0;
  tcu::LogImage::LogImage(&local_2f0,&local_390,&local_330,pSVar12,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write(&local_2f0,local_3d8.order,__buf,(size_t)pSVar12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.m_description._M_dataplus._M_p != &local_2f0.m_description.field_2) {
    operator_delete(local_2f0.m_description._M_dataplus._M_p,
                    local_2f0.m_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.m_name._M_dataplus._M_p != &local_2f0.m_name.field_2) {
    operator_delete(local_2f0.m_name._M_dataplus._M_p,
                    local_2f0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  if (local_370 != &local_360) {
    operator_delete(local_370,local_360 + 1);
  }
  if (local_350[0] != local_340) {
    operator_delete(local_350[0],local_340[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  if (local_3b8 != &local_3a8) {
    operator_delete(local_3b8,local_3a8 + 1);
  }
  if (local_310[0] != local_300) {
    operator_delete(local_310[0],local_300[0] + 1);
  }
  tcu::Surface::Surface((Surface *)&local_3b8,iVar5,height);
  if (0 < local_3d0.m_height) {
    poVar1 = (ostringstream *)(local_260 + 8);
    iVar5 = 0;
    bVar17 = true;
    do {
      if (0 < local_3d0.m_width) {
        iVar6 = 0;
        do {
          local_260._0_4_ =
               *(ChannelOrder *)
                ((long)local_3d0.m_pixels.m_ptr + (long)(local_3d0.m_width * iVar5 + iVar6) * 4);
          bVar3 = checkColor(this,local_398,(RGBA *)local_260,bVar17);
          lVar13 = (long)((int)local_3b8 * iVar5 + iVar6);
          if (bVar3) {
            *(undefined4 *)((long)local_3b0 + lVar13 * 4) = 0xff00ff00;
          }
          else {
            *(undefined4 *)((long)local_3b0 + lVar13 * 4) = 0xff0000ff;
            if (bVar17 != false) {
              local_260._0_4_ = local_3d8.order;
              local_260._4_4_ = local_3d8.type;
              std::__cxx11::ostringstream::ostringstream(poVar1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,"First failure at pixel (",0x18);
              std::ostream::operator<<(poVar1,iVar6);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
              std::ostream::operator<<(poVar1,iVar5);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,") (not printing further errors)",0x1f);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(poVar1);
              std::ios_base::~ios_base(local_1e8);
              bVar17 = false;
            }
          }
          iVar6 = iVar6 + 1;
        } while (iVar6 < local_3d0.m_width);
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < local_3d0.m_height);
    if (bVar17 == false) {
      paVar2 = &local_2f0.m_name.field_2;
      local_2f0.m_name._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2f0,"ColorChoiceErrorMask","");
      local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_390,"Error mask for color choices","");
      pSVar12 = (Surface *)&local_3b8;
      tcu::LogImage::LogImage
                ((LogImage *)local_260,&local_2f0.m_name,&local_390,pSVar12,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)local_260,local_3d8.order,__buf_00,(size_t)pSVar12);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_p != local_230) {
        operator_delete(local_240._M_p,local_230[0]._M_allocated_capacity + 1);
      }
      if (local_260._0_8_ != (long)local_260 + 0x10) {
        operator_delete((void *)local_260._0_8_,local_260._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_390._M_dataplus._M_p != &local_390.field_2) {
        operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0.m_name._M_dataplus._M_p != paVar2) {
        operator_delete(local_2f0.m_name._M_dataplus._M_p,
                        local_2f0.m_name.field_2._M_allocated_capacity + 1);
      }
      tcu::Surface::~Surface((Surface *)&local_3b8);
LAB_00610f14:
      bVar17 = false;
      goto LAB_00610f16;
    }
  }
  tcu::Surface::~Surface((Surface *)&local_3b8);
  bVar17 = true;
  if ((this->m_ditheringEnabled == false) && (0 < local_3d0.m_height)) {
    uVar14 = *local_3d0.m_pixels.m_ptr;
    lVar13 = 0;
    iVar5 = 0;
    do {
      if (0 < local_3d0.m_width) {
        uVar18 = 0;
        do {
          uVar16 = *(uint *)((long)local_3d0.m_pixels.m_ptr + (long)((int)lVar13 + (int)uVar18) * 4)
          ;
          if (uVar16 != uVar14) {
            poVar1 = (ostringstream *)(local_260 + 8);
            local_260._0_4_ = local_3d8.order;
            local_260._4_4_ = local_3d8.type;
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"Failure: color at (",0x13);
            std::ostream::operator<<(poVar1,(int)uVar18);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
            std::ostream::operator<<(poVar1,iVar5);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") is ",5);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"RGBA(",5);
            poVar9 = (ostream *)std::ostream::operator<<(poVar1,uVar16 & 0xff);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar16 >> 8 & 0xff);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar16 >> 0x10 & 0xff);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar16 >> 0x18);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,")",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1," and does not equal the color at (0, 0), which is ",0x32);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"RGBA(",5);
            poVar9 = (ostream *)std::ostream::operator<<(poVar1,uVar14 & 0xff);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar14 >> 8 & 0xff);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar14 >> 0x10 & 0xff);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar14 >> 0x18);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,")",1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            std::ios_base::~ios_base(local_1e8);
            goto LAB_00610f14;
          }
          uVar18 = uVar18 + 1;
        } while ((uint)local_3d0.m_width != uVar18);
      }
      iVar5 = iVar5 + 1;
      lVar13 = lVar13 + (ulong)(uint)local_3d0.m_width;
    } while (iVar5 != local_3d0.m_height);
  }
LAB_00610f16:
  tcu::Surface::~Surface(&local_3d0);
  return bVar17;
}

Assistant:

bool DitheringCase::drawAndCheckUnicoloredQuad (const Vec4& quadColor) const
{
	TestLog&					log					= m_testCtx.getLog();
	Random						rnd					(deStringHash(getName()));
	const int					maxViewportWid		= 32;
	const int					maxViewportHei		= 32;
	const int					viewportWid			= de::min(m_renderCtx.getRenderTarget().getWidth(), maxViewportWid);
	const int					viewportHei			= de::min(m_renderCtx.getRenderTarget().getHeight(), maxViewportHei);
	const int					viewportX			= rnd.getInt(0, m_renderCtx.getRenderTarget().getWidth() - viewportWid);
	const int					viewportY			= rnd.getInt(0, m_renderCtx.getRenderTarget().getHeight() - viewportHei);
	Quad						quad;
	Surface						renderedImg			(viewportWid, viewportHei);

	GLU_CHECK_CALL(glViewport(viewportX, viewportY, viewportWid, viewportHei));

	log << TestLog::Message << "Dithering is " << (m_ditheringEnabled ? "enabled" : "disabled") << TestLog::EndMessage;

	if (m_ditheringEnabled)
		GLU_CHECK_CALL(glEnable(GL_DITHER));
	else
		GLU_CHECK_CALL(glDisable(GL_DITHER));

	log << TestLog::Message << "Drawing an unicolored quad with color " << quadColor << TestLog::EndMessage;

	quad.color[0] = quadColor;
	quad.color[1] = quadColor;
	quad.color[2] = quadColor;
	quad.color[3] = quadColor;

	m_renderer->render(quad);

	glu::readPixels(m_renderCtx, viewportX, viewportY, renderedImg.getAccess());
	GLU_CHECK_MSG("glReadPixels()");

	log << TestLog::Image(("Quad" + de::toString(m_iteration)).c_str(), ("Quad " + de::toString(m_iteration)).c_str(), renderedImg);

	// Validate, at each pixel, that each color channel is one of its two allowed values.

	{
		Surface		errorMask		(viewportWid, viewportHei);
		bool		colorChoicesOk	= true;

		for (int y = 0; y < renderedImg.getHeight(); y++)
		{
			for (int x = 0; x < renderedImg.getWidth(); x++)
			{
				if (!checkColor(quadColor, renderedImg.getPixel(x, y), colorChoicesOk))
				{
					errorMask.setPixel(x, y, tcu::RGBA::red());

					if (colorChoicesOk)
					{
						log << TestLog::Message << "First failure at pixel (" << x << ", " << y << ") (not printing further errors)" << TestLog::EndMessage;
						colorChoicesOk = false;
					}
				}
				else
					errorMask.setPixel(x, y, tcu::RGBA::green());
			}
		}

		if (!colorChoicesOk)
		{
			log << TestLog::Image("ColorChoiceErrorMask", "Error mask for color choices", errorMask);
			return false;
		}
	}

	// When dithering is disabled, the color selection must be coordinate-independent - i.e. the entire rendered image must be unicolored.

	if (!m_ditheringEnabled)
	{
		const tcu::RGBA renderedClr00 = renderedImg.getPixel(0, 0);

		for (int y = 0; y < renderedImg.getHeight(); y++)
		{
			for (int x = 0; x < renderedImg.getWidth(); x++)
			{
				const tcu::RGBA curClr = renderedImg.getPixel(x, y);

				if (curClr != renderedClr00)
				{
					log << TestLog::Message
						<< "Failure: color at (" << x << ", " << y << ") is " << curClr
						<< " and does not equal the color at (0, 0), which is " << renderedClr00
						<< TestLog::EndMessage;

					return false;
				}
			}
		}
	}

	return true;
}